

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall spirv_cross::Compiler::is_immutable(Compiler *this,uint32_t id)

{
  Types TVar1;
  Variant *pVVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  SPIRAccessChain *pSVar6;
  SPIRExpression *pSVar7;
  undefined1 uVar8;
  
  pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  TVar1 = pVVar2[id].type;
  if (TVar1 - TypeVariable < 0xb) {
    pVVar2 = pVVar2 + id;
    uVar8 = 1;
    switch(TVar1) {
    case TypeVariable:
      pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar2);
      if ((pSVar4->storage != StorageClassUniformConstant) && (pSVar4->phi_variable == false)) {
        uVar3 = expression_type_id(this,id);
        pSVar5 = Variant::get<spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar3);
        uVar8 = pSVar5->basetype - Image < 3;
      }
      break;
    case TypeConstant:
    case TypeConstantOp:
    case TypeUndef:
      break;
    default:
      goto switchD_0028a69c_caseD_4;
    case TypeExpression:
      pSVar7 = Variant::get<spirv_cross::SPIRExpression>(pVVar2);
      uVar8 = pSVar7->immutable;
      break;
    case TypeAccessChain:
      pSVar6 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar2);
      uVar8 = pSVar6->immutable;
    }
  }
  else {
switchD_0028a69c_caseD_4:
    uVar8 = 0;
  }
  return (bool)uVar8;
}

Assistant:

bool Compiler::is_immutable(uint32_t id) const
{
	if (ir.ids[id].get_type() == TypeVariable)
	{
		auto &var = get<SPIRVariable>(id);

		// Anything we load from the UniformConstant address space is guaranteed to be immutable.
		bool pointer_to_const = var.storage == StorageClassUniformConstant;
		return pointer_to_const || var.phi_variable || !expression_is_lvalue(id);
	}
	else if (ir.ids[id].get_type() == TypeAccessChain)
		return get<SPIRAccessChain>(id).immutable;
	else if (ir.ids[id].get_type() == TypeExpression)
		return get<SPIRExpression>(id).immutable;
	else if (ir.ids[id].get_type() == TypeConstant || ir.ids[id].get_type() == TypeConstantOp ||
	         ir.ids[id].get_type() == TypeUndef)
		return true;
	else
		return false;
}